

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O2

void __thiscall
kj::_::anon_unknown_0::MockExceptionCallback::onRecoverableException
          (MockExceptionCallback *this,Exception *exception)

{
  string *this_00;
  Exception *params;
  String what;
  String local_40;
  undefined8 local_28;
  
  this_00 = &this->text;
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (this_00,"recoverable exception: ");
  str<kj::Exception&>(&what,(kj *)exception,params);
  local_40.content.disposer = (ArrayDisposer *)0x1ce8a2;
  local_28 = 9;
  String::find(&local_40,(StringPtr *)&what);
  if ((char)local_40.content.ptr == '\x01') {
    if (what.content.size_ == 0) {
      what.content.ptr = "";
    }
    ::std::__cxx11::string::append<char_const*,void>
              ((string *)this_00,what.content.ptr,what.content.ptr + local_40.content.size_);
  }
  else {
    if (what.content.size_ == 0) {
      what.content.ptr = "";
    }
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (this_00,what.content.ptr);
  }
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (this_00,'\n');
  flush(this);
  Array<char>::~Array(&what.content);
  return;
}

Assistant:

void onRecoverableException(Exception&& exception) override {
    text += "recoverable exception: ";
    auto what = str(exception);
    // Discard the stack trace.
    KJ_IF_SOME(end, what.find("\nstack: ")) {
      text.append(what.cStr(), what.cStr()+end);
    } else {
      text += what.cStr();
    }